

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputOutput.h
# Opt level: O2

void idx2::ReadLines<256>(FILE *Fp,array<idx2::stack_array<char,_256>_> *Lines)

{
  char *pcVar1;
  size_t sVar2;
  long lVar3;
  stref Dst;
  stref Src;
  char Temp [256];
  
  while( true ) {
    pcVar1 = fgets(Temp,0x100,(FILE *)Fp);
    if (pcVar1 == (char *)0x0) break;
    Src.field_0.Ptr = Temp;
    sVar2 = strlen(Temp);
    Src.Size = (int)sVar2;
    if (Temp[(long)((sVar2 << 0x20) + -0x100000000) >> 0x20] == '\n') {
      Temp[(long)((sVar2 << 0x20) + -0x200000000) >> 0x20] = '\0';
    }
    lVar3 = Lines->Size;
    if (Lines->Capacity <= lVar3) {
      GrowCapacity<idx2::stack_array<char,256>>(Lines,0);
      lVar3 = Lines->Size;
    }
    Lines->Size = lVar3 + 1;
    Dst.field_0.Ptr = (str)((Lines->Buffer).Data + lVar3 * 0x101);
    Dst.Size = 0x100;
    Copy(&Src,&Dst,true);
  }
  return;
}

Assistant:

void
ReadLines(FILE* Fp, array<stack_array<char, N>>* Lines)
{
  while (true)
  {
    char Temp[N];
    if (!fgets(Temp, N, Fp))
      return;

    stref Src(Temp);
    if (Temp[Src.Size - 1] == '\n')
      Temp[Src.Size - 2] = 0; // override the new line character
    PushBack(Lines);
    stref Dst(Back(*Lines).Arr, N);
    Copy(Src, &Dst, true);
  }
}